

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZ77_test.cpp
# Opt level: O0

void __thiscall CheckLz77Node::test_method(CheckLz77Node *this)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  undefined4 local_148;
  int local_144;
  basic_cstring<const_char> local_140;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_130;
  basic_cstring<const_char> local_108;
  basic_cstring<const_char> local_f8;
  undefined4 local_e8;
  int local_e4;
  basic_cstring<const_char> local_e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d0;
  basic_cstring<const_char> local_a8;
  basic_cstring<const_char> local_98;
  undefined1 local_86;
  char local_85 [13];
  basic_cstring<const_char> local_78;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_68;
  basic_cstring<const_char> local_40;
  basic_cstring<const_char> local_30;
  undefined1 local_1c [8];
  Lz77Node node;
  CheckLz77Node *this_local;
  
  node._4_8_ = this;
  Lz77Node::Lz77Node((Lz77Node *)local_1c,'a',0x2a,0x15);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_40);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_30,0x2f,&local_40);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_68,plVar3,(char (*) [1])0x116590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_78,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    local_85[0] = Lz77Node::get_symbol((Lz77Node *)local_1c);
    local_86 = 0x61;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,char>
              (&local_68,&local_78,0x2f,1,2,local_85,"node.get_symbol()",&local_86,"\'a\'");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_98,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_98,0x30,&local_a8);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d0,plVar3,(char (*) [1])0x116590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    local_e4 = Lz77Node::get_offset((Lz77Node *)local_1c);
    local_e8 = 0x2a;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d0,&local_e0,0x30,1,2,&local_e4,"node.get_offset()",&local_e8,"42");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_108);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f8,0x31,&local_108);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_130,plVar3,(char (*) [1])0x116590);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_140,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dabudabot[P]CifeProject/test/LZ77_test.cpp"
               ,0x61);
    local_144 = Lz77Node::get_amount((Lz77Node *)local_1c);
    local_148 = 0x15;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_130,&local_140,0x31,1,2,&local_144,"node.get_amount()",&local_148,"21");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_130);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(CheckLz77Node) {
  const auto node = Lz77Node('a', 42, 21);

  BOOST_CHECK_EQUAL(node.get_symbol(), 'a');
  BOOST_CHECK_EQUAL(node.get_offset(), 42);
  BOOST_CHECK_EQUAL(node.get_amount(), 21);
}